

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.c
# Opt level: O2

void ma_context_enumerate_devices_sink_callback__pulse
               (ma_pa_context *pPulseContext,ma_pa_sink_info *pSinkInfo,wchar_t endOfList,
               void *pUserData)

{
  int iVar1;
  ma_device_info_conflict deviceInfo;
  
  if (pUserData != (void *)0x0) {
    if ((endOfList == L'\0') && (*(int *)((long)pUserData + 0x18) == 0)) {
      memset(&deviceInfo,0,0x608);
      if (pSinkInfo->name != (char *)0x0) {
        ma_strncpy_s((char *)&deviceInfo,0x100,pSinkInfo->name,0xffffffffffffffff);
      }
      if (pSinkInfo->description != (char *)0x0) {
        ma_strncpy_s(deviceInfo.name,0x100,pSinkInfo->description,0xffffffffffffffff);
      }
      if (pSinkInfo->index == *(ma_uint32 *)((long)pUserData + 0x1c)) {
        deviceInfo.isDefault = 1;
      }
      iVar1 = (**(code **)((long)pUserData + 8))
                        (*pUserData,1,&deviceInfo,*(undefined8 *)((long)pUserData + 0x10));
      *(uint *)((long)pUserData + 0x18) = (uint)(iVar1 == 0);
    }
    return;
  }
  __assert_fail("pData != ((void*)0)",
                "/workspace/llm4binary/github/license_c_cmakelists/stoneface86[P]trackerboy/vendored/miniaudio/miniaudio.c"
                ,0x44bc,
                "void ma_context_enumerate_devices_sink_callback__pulse(ma_pa_context *, const ma_pa_sink_info *, int, void *)"
               );
}

Assistant:

static void ma_context_enumerate_devices_sink_callback__pulse(ma_pa_context* pPulseContext, const ma_pa_sink_info* pSinkInfo, int endOfList, void* pUserData)
{
    ma_context_enumerate_devices_callback_data__pulse* pData = (ma_context_enumerate_devices_callback_data__pulse*)pUserData;
    ma_device_info deviceInfo;

    MA_ASSERT(pData != NULL);

    if (endOfList || pData->isTerminated) {
        return;
    }

    MA_ZERO_OBJECT(&deviceInfo);

    /* The name from PulseAudio is the ID for miniaudio. */
    if (pSinkInfo->name != NULL) {
        ma_strncpy_s(deviceInfo.id.pulse, sizeof(deviceInfo.id.pulse), pSinkInfo->name, (size_t)-1);
    }

    /* The description from PulseAudio is the name for miniaudio. */
    if (pSinkInfo->description != NULL) {
        ma_strncpy_s(deviceInfo.name, sizeof(deviceInfo.name), pSinkInfo->description, (size_t)-1);
    }

    if (pSinkInfo->index == pData->defaultDeviceIndexPlayback) {
        deviceInfo.isDefault = MA_TRUE;
    }

    pData->isTerminated = !pData->callback(pData->pContext, ma_device_type_playback, &deviceInfo, pData->pUserData);

    (void)pPulseContext; /* Unused. */
}